

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlTextReaderSetErrorHandler(PyObject *self,PyObject *args)

{
  long *plVar1;
  int iVar2;
  undefined8 *puVar3;
  PyObject *pPVar4;
  undefined8 uVar5;
  PyObject *pyobj_f;
  PyObject *pyobj_arg;
  PyObject *pyobj_reader;
  xmlTextReaderErrorFunc f;
  void *arg;
  long *local_40;
  long *local_38;
  undefined *local_30;
  code *local_28;
  undefined8 *local_20;
  
  iVar2 = _PyArg_ParseTuple_SizeT
                    (args,"OOO:xmlTextReaderSetErrorHandler",&local_30,&local_40,&local_38);
  if (iVar2 == 0) {
    return (PyObject *)0x0;
  }
  if (local_30 == &_Py_NoneStruct) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(local_30 + 0x10);
  }
  xmlTextReaderGetErrorHandler(uVar5,&local_28,&local_20);
  if (local_20 != (undefined8 *)0x0) {
    iVar2 = -1;
    if (local_28 != libxml_xmlTextReaderErrorCallback) goto LAB_0013e0a3;
    plVar1 = (long *)*local_20;
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc();
    }
    plVar1 = (long *)local_20[1];
    if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
      _Py_Dealloc();
    }
    (*_xmlFree)(local_20);
  }
  xmlTextReaderSetErrorHandler(uVar5,0,0);
  iVar2 = 1;
  if (local_40 != (long *)&_Py_NoneStruct) {
    puVar3 = (undefined8 *)(*_xmlMalloc)(0x10);
    if (puVar3 == (undefined8 *)0x0) {
      iVar2 = -1;
    }
    else {
      if (local_40 != (long *)0x0) {
        *local_40 = *local_40 + 1;
      }
      *puVar3 = local_40;
      if (local_38 != (long *)0x0) {
        *local_38 = *local_38 + 1;
      }
      puVar3[1] = local_38;
      xmlTextReaderSetErrorHandler(uVar5,libxml_xmlTextReaderErrorCallback,puVar3);
    }
  }
LAB_0013e0a3:
  pPVar4 = libxml_intWrap(iVar2);
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlTextReaderSetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args)
{
    xmlTextReaderPtr reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;
    PyObject *pyobj_reader;
    PyObject *pyobj_f;
    PyObject *pyobj_arg;
    PyObject *py_retval;

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlTextReaderSetErrorHandler", &pyobj_reader, &pyobj_f, &pyobj_arg))
        return(NULL);
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    /* clear previous error handler */
    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    if (arg != NULL) {
	if (f == (xmlTextReaderErrorFunc) libxml_xmlTextReaderErrorCallback) {
	    /* ok, it's our error handler! */
	    pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	else {
	    /* 
	     * there already an arg, and it's not ours,
	     * there is definitely something wrong going on here...
	     * we don't know how to free it, so we bail out... 
	     */
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
    }
    xmlTextReaderSetErrorHandler(reader,NULL,NULL);
    /* set new error handler */
    if (pyobj_f != Py_None)
    {
	pyCtxt = (xmlTextReaderPyCtxtPtr)xmlMalloc(sizeof(xmlTextReaderPyCtxt));
	if (pyCtxt == NULL) {
	    py_retval = libxml_intWrap(-1);
	    return(py_retval);
	}
	Py_XINCREF(pyobj_f);
	pyCtxt->f = pyobj_f;
	Py_XINCREF(pyobj_arg);
	pyCtxt->arg = pyobj_arg;
	xmlTextReaderSetErrorHandler(reader,
	                             libxml_xmlTextReaderErrorCallback,
	                             pyCtxt);
    }

    py_retval = libxml_intWrap(1);
    return(py_retval);
}